

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O2

void mp::
     WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_2>>>
               (MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *jw,
               ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_>_>
               *condc)

{
  string_view key;
  string_view key_00;
  int local_44;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_40;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_30;
  
  local_44 = (condc->
             super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_>_>_>
             ).super_FunctionalConstraint.result_var_;
  key._M_str = (char *)0x7;
  key._M_len = (size_t)jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_30,key);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&local_30,
             &local_44);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter(&local_30);
  key_00._M_str = (char *)0x3;
  key_00._M_len = (size_t)jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_40,key_00)
  ;
  WriteJSON<mp::LinTerms,mp::AlgConRhs<_2>>
            (&local_40,
             &(condc->
              super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_>_>_>
              ).
              super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_>_>_>
              .args_);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter(&local_40);
  return;
}

Assistant:

inline void WriteJSON(JW jw,
                      const ConditionalConstraint<Con>& condc) {
  jw["res_var"] = condc.GetResultVar();
  WriteJSON(jw["con"], condc.GetConstraint());
}